

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O0

char * strip_function_from(char *token,char *function_name)

{
  _Bool _Var1;
  char cVar2;
  size_t sVar3;
  size_t sVar4;
  char *in_RSI;
  char *in_RDI;
  int parameter_length;
  char *pcVar5;
  int parameter_length_00;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  _Var1 = begins_with(in_RSI,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  if ((_Var1) && (pcVar5 = in_RDI, sVar3 = strlen(in_RSI), pcVar5[sVar3] == '(')) {
    cVar2 = last_char_of((char *)0x10ed72);
    parameter_length_00 = (int)((ulong)pcVar5 >> 0x20);
    if (cVar2 == ')') {
      sVar3 = strlen(in_RDI);
      sVar4 = strlen(in_RSI);
      move_parameter_to_beginning_of
                (in_RSI,(char *)CONCAT44(((int)sVar3 - (int)sVar4) + -2,in_stack_ffffffffffffffe8),
                 parameter_length_00);
    }
  }
  return in_RDI;
}

Assistant:

static char *strip_function_from(char *token, const char *function_name) {
    if (begins_with(token, function_name) && token[strlen(function_name)] == '(' && last_char_of(token) == ')') {
        int parameter_length = strlen(token) - strlen(function_name) - strlen("()");
        move_parameter_to_beginning_of(token, function_name, parameter_length);
    }

    return token;
}